

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_table_scan.cpp
# Opt level: O2

void duckdb::AddProjectionNames(ColumnIndex *index,string *name,LogicalType *type,string *result)

{
  pointer pCVar1;
  child_list_t<LogicalType> *this;
  const_reference __rhs;
  pointer index_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((index->child_indexes).super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
      .super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (index->child_indexes).super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
      .super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this = StructType::GetChildTypes_abi_cxx11_(type);
    pCVar1 = (index->child_indexes).
             super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
             super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (index_00 = (index->child_indexes).
                    super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                    super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                    _M_impl.super__Vector_impl_data._M_start; index_00 != pCVar1;
        index_00 = index_00 + 1) {
      __rhs = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
              ::get<true>(this,index_00->index);
      ::std::operator+(&local_70,name,".");
      ::std::operator+(&local_50,&local_70,&__rhs->first);
      AddProjectionNames(index_00,&local_50,&__rhs->second,result);
      ::std::__cxx11::string::~string((string *)&local_50);
      ::std::__cxx11::string::~string((string *)&local_70);
    }
    return;
  }
  if (result->_M_string_length != 0) {
    ::std::__cxx11::string::append((char *)result);
  }
  ::std::__cxx11::string::append((string *)result);
  return;
}

Assistant:

void AddProjectionNames(const ColumnIndex &index, const string &name, const LogicalType &type, string &result) {
	if (!index.HasChildren()) {
		// base case - no children projected out
		if (!result.empty()) {
			result += "\n";
		}
		result += name;
		return;
	}
	auto &child_types = StructType::GetChildTypes(type);
	for (auto &child_index : index.GetChildIndexes()) {
		auto &ele = child_types[child_index.GetPrimaryIndex()];
		AddProjectionNames(child_index, name + "." + ele.first, ele.second, result);
	}
}